

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discontinuous_fe_constant.h
# Opt level: O0

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
projects::dpg::FeDiscontinuousO0Quad<double>::EvalReferenceShapeFunctions
          (Matrix<double,__1,__1,_0,__1,__1> *__return_storage_ptr__,
          FeDiscontinuousO0Quad<double> *this,MatrixXd *refcoords)

{
  Index IVar1;
  RowXpr local_300;
  Scalar local_2c8;
  ConstantReturnType local_2c0;
  int local_2a8;
  undefined1 local_2a1;
  uint local_2a0;
  allocator<char> local_299;
  size_type n_pts;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_20;
  MatrixXd *refcoords_local;
  FeDiscontinuousO0Quad<double> *this_local;
  Matrix<double,__1,__1,_0,__1,__1> *result;
  
  local_20 = &refcoords->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>;
  refcoords_local = (MatrixXd *)this;
  this_local = (FeDiscontinuousO0Quad<double> *)__return_storage_ptr__;
  IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&refcoords->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  if (IVar1 == 2) {
    IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols(local_20);
    local_2a0 = (uint)IVar1;
    local_2a1 = 0;
    local_2a8 = 1;
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_int>
              ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,&local_2a8,&local_2a0);
    local_2c8 = 1.0;
    Eigen::DenseBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::Constant
              (&local_2c0,(ulong)local_2a0,&local_2c8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              (&local_300,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__,0);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false> *)&local_300,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
                *)&local_2c0);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(local_198,"Reference coordinates must be 2-vectors");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"refcoords.rows() == 2",&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../discontinuous_fe_constant.h"
             ,&local_201);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_1d8,&local_200,0xa5,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"false",&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../discontinuous_fe_constant.h"
             ,&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&n_pts,"",&local_299);
  lf::base::AssertionFailed(&local_248,&local_270,0xa5,(string *)&n_pts);
  std::__cxx11::string::~string((string *)&n_pts);
  std::allocator<char>::~allocator(&local_299);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  abort();
}

Assistant:

[[nodiscard]] Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic>
  EvalReferenceShapeFunctions(const Eigen::MatrixXd& refcoords) const override {
    LF_ASSERT_MSG(refcoords.rows() == 2,
                  "Reference coordinates must be 2-vectors");
    const size_type n_pts(refcoords.cols());
    Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic> result(1, n_pts);
    result.row(0) = Eigen::RowVectorXd::Constant(n_pts, 1);
    return result;
  }